

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexSeparableKernel.cpp
# Opt level: O1

void Ptex::v2_2::anon_unknown_4::ApplyN<unsigned_char>
               (PtexSeparableKernel *k,float *result,void *data,int nChan,int nTxChan)

{
  long lVar1;
  float fVar2;
  byte bVar3;
  float *pfVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  int iVar11;
  long lVar12;
  float *pfVar13;
  float *pfVar14;
  int iVar15;
  ulong uVar16;
  float afStack_48 [2];
  long local_40;
  int local_34;
  
  uVar5 = (ulong)(uint)nChan;
  lVar6 = -0x48 - ((long)nChan * 4 + 0xfU & 0xfffffffffffffff0);
  bVar3 = (k->res).ulog2;
  local_34 = nTxChan;
  iVar15 = nTxChan << (bVar3 & 0x1f);
  lVar8 = (long)iVar15 * (long)k->vw;
  if ((int)lVar8 != 0) {
    lVar9 = (long)data + (long)(((k->v << (bVar3 & 0x1f)) + k->u) * nTxChan);
    lVar8 = lVar8 + lVar9;
    pfVar4 = k->ku;
    pfVar13 = k->kv;
    lVar10 = (long)nTxChan;
    lVar12 = k->uw * lVar10;
    iVar11 = (int)lVar12;
    local_40 = (long)(iVar15 - iVar11);
    do {
      if (0 < nChan) {
        fVar2 = *pfVar4;
        uVar16 = 0;
        do {
          *(float *)((long)afStack_48 + uVar16 * 4 + lVar6 + 0x48) =
               (float)*(byte *)(lVar9 + uVar16) * fVar2;
          uVar16 = uVar16 + 1;
        } while (uVar5 != uVar16);
      }
      if (iVar11 != local_34) {
        lVar1 = lVar9 + lVar12;
        pfVar14 = pfVar4;
        lVar7 = lVar9 + lVar10;
        do {
          lVar9 = lVar7;
          if (0 < nChan) {
            fVar2 = pfVar14[1];
            uVar16 = 0;
            do {
              *(float *)((long)afStack_48 + uVar16 * 4 + lVar6 + 0x48) =
                   (float)*(byte *)(lVar9 + uVar16) * fVar2 +
                   *(float *)((long)afStack_48 + uVar16 * 4 + lVar6 + 0x48);
              uVar16 = uVar16 + 1;
            } while (uVar5 != uVar16);
          }
          pfVar14 = pfVar14 + 1;
          lVar7 = lVar9 + lVar10;
        } while (lVar9 + lVar10 != lVar1);
      }
      if (0 < nChan) {
        fVar2 = *pfVar13;
        uVar16 = 0;
        do {
          result[uVar16] =
               *(float *)((long)afStack_48 + uVar16 * 4 + lVar6 + 0x48) * fVar2 + result[uVar16];
          uVar16 = uVar16 + 1;
        } while (uVar5 != uVar16);
      }
      pfVar13 = pfVar13 + 1;
      lVar9 = lVar9 + lVar10 + local_40;
    } while (lVar9 != lVar8);
  }
  return;
}

Assistant:

void ApplyN(PtexSeparableKernel& k, float* result, void* data, int nChan, int nTxChan)
    {
        float* rowResult = (float*) alloca(nChan*sizeof(float));
        int rowlen = k.res.u() * nTxChan;
        int datalen = k.uw * nTxChan;
        int rowskip = rowlen - datalen;
        float* kvp = k.kv;
        T* p = static_cast<T*>(data) + (k.v * k.res.u() + k.u) * nTxChan;
        T* pEnd = p + k.vw * rowlen;
        while (p != pEnd)
        {
            float* kup = k.ku;
            T* pRowEnd = p + datalen;
            // just mult and copy first element
            PtexUtils::VecMultN<T>()(rowResult, p, nChan, *kup++);
            p += nTxChan;
            // accumulate remaining elements
            while (p != pRowEnd) {
                // rowResult[i] = p[i] * ku[u] for i in {0..n-1}
                PtexUtils::VecAccumN<T>()(rowResult, p, nChan, *kup++);
                p += nTxChan;
            }
            // result[i] += rowResult[i] * kv[v] for i in {0..n-1}
            PtexUtils::VecAccumN<float>()(result, rowResult, nChan, *kvp++);
            p += rowskip;
        }
    }